

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureSpecialInterleaved::prepareAndBind
          (CaptureSpecialInterleaved *this)

{
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  GLuint *pGVar5;
  GLuint i;
  long lVar6;
  Functions *gl;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  GVar2 = Utilities::buildProgram
                    (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                     s_vertex_shader,s_fragment_shader,s_xfb_varyings,7,0x8c8c,false,(GLint *)0x0);
  this->m_program_id = GVar2;
  if (GVar2 != 0) {
    (*gl->useProgram)(GVar2);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1429);
    (*gl->genTransformFeedbacks)(1,&this->m_xfb_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x142d);
    (*gl->bindTransformFeedback)(0x8e22,this->m_xfb_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1430);
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGenVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1434);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1437);
    pGVar5 = this->m_bo_id;
    (*gl->genBuffers)(2,pGVar5);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGenBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x143b);
    lVar6 = 0;
    do {
      (*gl->bindBuffer)(0x8c8e,pGVar5[lVar6]);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1440);
      (*gl->bufferData)(0x8c8e,0x30,(void *)0x0,0x88ea);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glBufferData call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1443);
      (*gl->bindBufferBase)(0x8c8e,(GLuint)lVar6,pGVar5[lVar6]);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glBindBufferRange call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1446);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureSpecialInterleaved::prepareAndBind()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader, s_fragment_shader, s_xfb_varyings,
		s_xfb_varyings_count, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id)
	{
		throw 0;
	}

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_bo_ids_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	for (glw::GLuint i = 0; i < s_bo_ids_count; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY); /* allocation */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");
	}
}